

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

void store_stock_list(store *store,object **list,wchar_t n)

{
  uint uVar1;
  object *new;
  uint uVar2;
  bool bVar3;
  _Bool _Var4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  object *orig;
  object **ppoVar9;
  
  uVar2 = store_home_idx;
  uVar1 = store->sidx;
  uVar5 = 0;
  uVar8 = (ulong)(uint)n;
  if (n < L'\x01') {
    uVar8 = uVar5;
  }
  uVar6 = 0;
  for (; uVar5 != uVar8; uVar5 = uVar5 + 1) {
    orig = (object *)0x0;
    ppoVar9 = &store->stock;
    while (new = *ppoVar9, new != (object *)0x0) {
      bVar3 = true;
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        bVar3 = (bool)(bVar3 & list[uVar7] != new);
      }
      if (bVar3) {
        _Var4 = earlier_object(orig,new,uVar1 != uVar2);
        if (_Var4) {
          orig = new;
        }
      }
      ppoVar9 = &new->next;
    }
    list[uVar5] = orig;
    uVar6 = (ulong)(((int)uVar6 + 1) - (uint)(orig == (object *)0x0));
  }
  return;
}

Assistant:

void store_stock_list(struct store *store, struct object **list, int n)
{
	bool not_home = store_is_home(store) ? false : true;
	int list_num;
	int num = 0;

	for (list_num = 0; list_num < n; list_num++) {
		struct object *current, *first = NULL;
		for (current = store->stock; current; current = current->next) {
			int i;
			bool possible = true;

			/* Skip objects already allocated */
			for (i = 0; i < num; i++)
				if (list[i] == current)
					possible = false;

			/* If still possible, choose the first in order */
			if (!possible)
				continue;
			else if (earlier_object(first, current, not_home))
				first = current;
		}

		/* Allocate and count the stock */
		list[list_num] = first;
		if (first)
			num++;
	}
}